

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_DataStructures_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/DataStructures.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_FeatureTypes_2eproto::InitDefaults();
  DAT_007219b0 = (undefined8 *)0x0;
  _DAT_007219b8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_007219c0 = 0;
  uRam00000000007219c8 = 0;
  _DAT_007219d0 = 0;
  _StringToInt64Map_MapEntry_default_instance_ = &PTR__MapEntryImpl_006fc558;
  DAT_007219d8 = 1;
  StringToInt64Map::StringToInt64Map((StringToInt64Map *)&_StringToInt64Map_default_instance_);
  DAT_00721a18 = 1;
  _DAT_00721a40 = 0;
  DAT_00721a28 = (undefined8 *)0x0;
  uRam0000000000721a30 = 0;
  _DAT_00721a38 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_00721a48 = 0;
  _Int64ToStringMap_MapEntry_default_instance_ = &PTR__MapEntryImpl_006fc6d8;
  DAT_00721a50 = 1;
  Int64ToStringMap::Int64ToStringMap((Int64ToStringMap *)&_Int64ToStringMap_default_instance_);
  DAT_00721a90 = 1;
  DAT_00721aa0 = (undefined8 *)0x0;
  _DAT_00721aa8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_00721ab0 = 0;
  uRam0000000000721ab8 = 0;
  _DAT_00721ac0 = 0;
  _StringToDoubleMap_MapEntry_default_instance_ = &PTR__MapEntryImpl_006fc858;
  DAT_00721ac8 = 1;
  StringToDoubleMap::StringToDoubleMap((StringToDoubleMap *)&_StringToDoubleMap_default_instance_);
  DAT_00721b08 = 1;
  DAT_00721b18 = (undefined8 *)0x0;
  uRam0000000000721b20 = 0;
  _DAT_00721b28 = 0;
  uRam0000000000721b30 = 0;
  _DAT_00721b38 = 0;
  _Int64ToDoubleMap_MapEntry_default_instance_ = &PTR__MapEntryImpl_006fc9d8;
  DAT_00721b40 = 1;
  Int64ToDoubleMap::Int64ToDoubleMap((Int64ToDoubleMap *)&_Int64ToDoubleMap_default_instance_);
  DAT_00721b80 = 1;
  StringVector::StringVector((StringVector *)&_StringVector_default_instance_);
  DAT_00721bb8 = 1;
  Int64Vector::Int64Vector((Int64Vector *)&_Int64Vector_default_instance_);
  DAT_00721be8 = 1;
  FloatVector::FloatVector((FloatVector *)&_FloatVector_default_instance_);
  DAT_00721c18 = 1;
  DoubleVector::DoubleVector((DoubleVector *)&_DoubleVector_default_instance_);
  DAT_00721c48 = 1;
  Int64Range::Int64Range((Int64Range *)&_Int64Range_default_instance_);
  DAT_00721c78 = 1;
  Int64Set::Int64Set((Int64Set *)&_Int64Set_default_instance_);
  DAT_00721ca8 = 1;
  DoubleRange::DoubleRange((DoubleRange *)&_DoubleRange_default_instance_);
  DAT_00721cd8 = 1;
  DAT_007219b0 = &_StringToInt64Map_MapEntry_default_instance_;
  DAT_00721a28 = &_Int64ToStringMap_MapEntry_default_instance_;
  DAT_00721aa0 = &_StringToDoubleMap_MapEntry_default_instance_;
  DAT_00721b18 = &_Int64ToDoubleMap_MapEntry_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_FeatureTypes_2eproto::InitDefaults();
  _StringToInt64Map_MapEntry_default_instance_.DefaultConstruct();
  _StringToInt64Map_default_instance_.DefaultConstruct();
  _Int64ToStringMap_MapEntry_default_instance_.DefaultConstruct();
  _Int64ToStringMap_default_instance_.DefaultConstruct();
  _StringToDoubleMap_MapEntry_default_instance_.DefaultConstruct();
  _StringToDoubleMap_default_instance_.DefaultConstruct();
  _Int64ToDoubleMap_MapEntry_default_instance_.DefaultConstruct();
  _Int64ToDoubleMap_default_instance_.DefaultConstruct();
  _StringVector_default_instance_.DefaultConstruct();
  _Int64Vector_default_instance_.DefaultConstruct();
  _FloatVector_default_instance_.DefaultConstruct();
  _DoubleVector_default_instance_.DefaultConstruct();
  _Int64Range_default_instance_.DefaultConstruct();
  _Int64Set_default_instance_.DefaultConstruct();
  _DoubleRange_default_instance_.DefaultConstruct();
  _StringToInt64Map_MapEntry_default_instance_.get_mutable()->set_default_instance(_StringToInt64Map_MapEntry_default_instance_.get_mutable());
  _StringToInt64Map_MapEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Int64ToStringMap_MapEntry_default_instance_.get_mutable()->set_default_instance(_Int64ToStringMap_MapEntry_default_instance_.get_mutable());
  _Int64ToStringMap_MapEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _StringToDoubleMap_MapEntry_default_instance_.get_mutable()->set_default_instance(_StringToDoubleMap_MapEntry_default_instance_.get_mutable());
  _StringToDoubleMap_MapEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Int64ToDoubleMap_MapEntry_default_instance_.get_mutable()->set_default_instance(_Int64ToDoubleMap_MapEntry_default_instance_.get_mutable());
  _Int64ToDoubleMap_MapEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
}